

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.h
# Opt level: O0

int getNumWidth(size_t n)

{
  undefined4 local_14;
  int numWidth;
  size_t n_local;
  
  local_14 = 1;
  if (9 < n) {
    local_14 = 2;
  }
  if (99 < n) {
    local_14 = 3;
  }
  return local_14;
}

Assistant:

inline int getNumWidth(size_t n)
{
  int numWidth = 1;
  if (n >= 10) {
    numWidth = 2;
  }
  if (n >= 100) {
    numWidth = 3;
  }
  return numWidth;
}